

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O0

LogStream * __thiscall LogStream::operator<<(LogStream *this,char *str)

{
  size_t len;
  char *str_local;
  LogStream *this_local;
  
  if (str == (char *)0x0) {
    FixedBuffer<4000>::append(&this->buffer_,"(null)",6);
  }
  else {
    len = strlen(str);
    FixedBuffer<4000>::append(&this->buffer_,str,len);
  }
  return this;
}

Assistant:

LogStream& operator<<(const char* str) {
        if (str)
            buffer_.append(str, strlen(str));
        else
            buffer_.append("(null)", 6);
        return *this;
    }